

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
               (RecyclableObject *instance,uint32 index,Var *setterValue,DescriptorFlags *flags,
               ScriptContext *scriptContext,BOOL skipPrototypeCheck)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DescriptorFlags DVar4;
  undefined4 *puVar5;
  bool local_4a;
  bool local_49;
  RecyclableObject *local_48;
  RecyclableObject *object;
  BOOL skipPrototypeCheck_local;
  ScriptContext *scriptContext_local;
  DescriptorFlags *flags_local;
  Var *setterValue_local;
  uint32 index_local;
  RecyclableObject *instance_local;
  
  if (setterValue == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x986,"(setterValue)","setterValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (flags == (DescriptorFlags *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x987,"(flags)","flags");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance);
  local_48 = instance;
  if (bVar2) {
    instance_local._4_4_ = 0;
  }
  else {
    while (BVar3 = IsNull(local_48), BVar3 == 0) {
      DVar4 = (*(local_48->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x28])(local_48,(ulong)index,setterValue,scriptContext)
      ;
      *flags = DVar4;
      if ((*flags != None) || (skipPrototypeCheck != 0)) break;
      local_48 = RecyclableObject::GetPrototype(local_48);
    }
    local_49 = true;
    if (((*flags & Accessor) != Accessor) && (local_49 = true, (*flags & Proxy) != Proxy)) {
      local_4a = false;
      if ((*flags & Data) == Data) {
        local_4a = (*flags & Writable) == None;
      }
      local_49 = local_4a;
    }
    instance_local._4_4_ = (uint)local_49;
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(RecyclableObject* instance, uint32 index,
        Var* setterValue, DescriptorFlags *flags, ScriptContext* scriptContext, BOOL skipPrototypeCheck /* = FALSE */)
    {
        Assert(setterValue);
        Assert(flags);

        // Do a quick walk up the prototype chain to see if any of the prototypes has ever had ANY setter or non-writable property.
        if (CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance))
        {
            return FALSE;
        }

        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            *flags = object->GetItemSetter(index, setterValue, scriptContext);
            if (*flags != None || skipPrototypeCheck)
            {
                break;
            }
            object = object->GetPrototype();
        }

        return ((*flags & Accessor) == Accessor) || ((*flags & Proxy) == Proxy) || ((*flags & Data) == Data && (*flags & Writable) == None);
    }